

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O2

void __thiscall Kss_Emu::set_bank(Kss_Emu *this,int logical,int physical)

{
  byte bVar1;
  byte *read;
  uint size;
  uint uVar2;
  uint addr;
  uint offset;
  uint uVar3;
  
  bVar1 = (this->header_).super_header_t.bank_mode;
  size = 0x4000 >> (bVar1 >> 7);
  addr = 0x8000;
  if (logical != 0) {
    addr = (bVar1 >> 7 | 4) << 0xd;
  }
  uVar2 = physical - (uint)(this->header_).super_header_t.first_bank;
  if (uVar2 < (uint)this->bank_count) {
    for (uVar3 = 0; uVar3 < size; uVar3 = uVar3 + 0x2000) {
      read = Rom_Data<8192>::at_addr(&this->rom,uVar2 * size + uVar3);
      Kss_Cpu::map_mem(&this->super_Kss_Cpu,addr + uVar3,0x2000,this->unmapped_write,read);
    }
    return;
  }
  Kss_Cpu::map_mem(&this->super_Kss_Cpu,addr,size,this->ram + addr,this->ram + addr);
  return;
}

Assistant:

void Kss_Emu::set_bank( int logical, int physical )
{
	unsigned const bank_size = this->bank_size();
	
	unsigned addr = 0x8000;
	if ( logical && bank_size == 8 * 1024 )
		addr = 0xA000;
	
	physical -= header_.first_bank;
	if ( (unsigned) physical >= (unsigned) bank_count )
	{
		byte* data = ram + addr;
		cpu::map_mem( addr, bank_size, data, data );
	}
	else
	{
		long phys = physical * (blargg_long) bank_size;
		for ( unsigned offset = 0; offset < bank_size; offset += page_size )
			cpu::map_mem( addr + offset, page_size,
					unmapped_write, rom.at_addr( phys + offset ) );
	}
}